

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronParserCtxtPtr xmlSchematronNewParserCtxt(char *URL)

{
  xmlDictPtr pxVar1;
  xmlChar *pxVar2;
  xmlXPathContextPtr pxVar3;
  xmlSchematronParserCtxtPtr ret;
  char *URL_local;
  
  if (URL == (char *)0x0) {
    URL_local = (char *)0x0;
  }
  else {
    URL_local = (char *)(*xmlMalloc)(0x90);
    if ((xmlSchematronParserCtxtPtr)URL_local == (xmlSchematronParserCtxtPtr)0x0) {
      xmlSchematronPErrMemory
                ((xmlSchematronParserCtxtPtr)0x0,"allocating schema parser context",(xmlNodePtr)0x0)
      ;
      URL_local = (char *)0x0;
    }
    else {
      memset(URL_local,0,0x90);
      ((xmlSchematronParserCtxtPtr)URL_local)->type = 1;
      pxVar1 = xmlDictCreate();
      ((xmlSchematronParserCtxtPtr)URL_local)->dict = pxVar1;
      pxVar2 = xmlDictLookup(((xmlSchematronParserCtxtPtr)URL_local)->dict,(xmlChar *)URL,-1);
      ((xmlSchematronParserCtxtPtr)URL_local)->URL = pxVar2;
      ((xmlSchematronParserCtxtPtr)URL_local)->includes = (xmlNodePtr *)0x0;
      pxVar3 = xmlXPathNewContext((xmlDocPtr)0x0);
      ((xmlSchematronParserCtxtPtr)URL_local)->xctxt = pxVar3;
      if (((xmlSchematronParserCtxtPtr)URL_local)->xctxt == (xmlXPathContextPtr)0x0) {
        xmlSchematronPErrMemory
                  ((xmlSchematronParserCtxtPtr)0x0,"allocating schema parser XPath context",
                   (xmlNodePtr)0x0);
        xmlSchematronFreeParserCtxt((xmlSchematronParserCtxtPtr)URL_local);
        URL_local = (char *)0x0;
      }
      else {
        ((xmlSchematronParserCtxtPtr)URL_local)->xctxt->flags = 1;
      }
    }
  }
  return (xmlSchematronParserCtxtPtr)URL_local;
}

Assistant:

xmlSchematronParserCtxtPtr
xmlSchematronNewParserCtxt(const char *URL)
{
    xmlSchematronParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret =
        (xmlSchematronParserCtxtPtr)
        xmlMalloc(sizeof(xmlSchematronParserCtxt));
    if (ret == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser context",
                                NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronParserCtxt));
    ret->type = XML_STRON_CTXT_PARSER;
    ret->dict = xmlDictCreate();
    ret->URL = xmlDictLookup(ret->dict, (const xmlChar *) URL, -1);
    ret->includes = NULL;
    ret->xctxt = xmlXPathNewContext(NULL);
    if (ret->xctxt == NULL) {
        xmlSchematronPErrMemory(NULL, "allocating schema parser XPath context",
                                NULL);
        xmlSchematronFreeParserCtxt(ret);
        return (NULL);
    }
    ret->xctxt->flags = XML_XPATH_CHECKNS;
    return (ret);
}